

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxkbcommon.cpp
# Opt level: O2

KeyboardModifiers QXkbCommon::modifiers(xkb_state *state,xkb_keysym_t keysym)

{
  int iVar1;
  QFlagsStorage<Qt::KeyboardModifier> QVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = xkb_state_mod_name_is_active(state,"Control",8);
  uVar4 = (uint)(0 < iVar1) * 0x4000000;
  iVar1 = xkb_state_mod_name_is_active(state,"Mod1",8);
  uVar3 = uVar4 + 0x8000000;
  if (iVar1 < 1) {
    uVar3 = uVar4;
  }
  iVar1 = xkb_state_mod_name_is_active(state,"Shift",8);
  uVar4 = uVar3 + 0x2000000;
  if (iVar1 < 1) {
    uVar4 = uVar3;
  }
  iVar1 = xkb_state_mod_name_is_active(state,"Mod4",8);
  QVar2.i = uVar4 | 0x10000000;
  if (iVar1 < 1) {
    QVar2.i = uVar4;
  }
  if ((keysym - 0xff80 < 0x3e) &&
     ((0x23fffc00fffe2201U >> ((ulong)(keysym - 0xff80) & 0x3f) & 1) != 0)) {
    QVar2.i = QVar2.i | 0x20000000;
  }
  return (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
         (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)QVar2.i;
}

Assistant:

Qt::KeyboardModifiers QXkbCommon::modifiers(struct xkb_state *state, xkb_keysym_t keysym)
{
    Qt::KeyboardModifiers modifiers = Qt::NoModifier;

    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_CTRL, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::ControlModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_ALT, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::AltModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_SHIFT, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::ShiftModifier;
    if (xkb_state_mod_name_is_active(state, XKB_MOD_NAME_LOGO, XKB_STATE_MODS_EFFECTIVE) > 0)
        modifiers |= Qt::MetaModifier;

    if (isKeypad(keysym))
        modifiers |= Qt::KeypadModifier;

    return modifiers;
}